

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ApplicationFolder.cpp
# Opt level: O0

void __thiscall license::locate::ApplicationFolder::~ApplicationFolder(ApplicationFolder *this)

{
  ApplicationFolder *this_local;
  
  ~ApplicationFolder(this);
  operator_delete(this);
  return;
}

Assistant:

ApplicationFolder::~ApplicationFolder() {}